

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_range.cc
# Opt level: O1

void re2c::UTF16splitByContinuity
               (RangeSuffix **root,uint32_t l_ld,uint32_t h_ld,uint32_t l_tr,uint32_t h_tr)

{
  while (l_ld != h_ld) {
    if (l_tr < 0xdc01) {
      if (0xdffe < h_tr) break;
      UTF16splitByContinuity(root,l_ld,h_ld - 1,l_tr,0xdfff);
      l_tr = 0xdc00;
      l_ld = h_ld;
    }
    else {
      UTF16splitByContinuity(root,l_ld,l_ld,l_tr,0xdfff);
      l_ld = l_ld + 1;
      l_tr = 0xdc00;
    }
  }
  UTF16addContinuous2(root,l_ld,h_ld,l_tr,h_tr);
  return;
}

Assistant:

void UTF16splitByContinuity(RangeSuffix * & root, uint32_t l_ld, uint32_t h_ld, uint32_t l_tr, uint32_t h_tr)
{
	if (l_ld != h_ld)
	{
		if (l_tr > utf16::MIN_TRAIL_SURR)
		{
			UTF16splitByContinuity(root, l_ld, l_ld, l_tr, utf16::MAX_TRAIL_SURR);
			UTF16splitByContinuity(root, l_ld + 1, h_ld, utf16::MIN_TRAIL_SURR, h_tr);
			return;
		}
		if (h_tr < utf16::MAX_TRAIL_SURR)
		{
			UTF16splitByContinuity(root, l_ld, h_ld - 1, l_tr, utf16::MAX_TRAIL_SURR);
			UTF16splitByContinuity(root, h_ld, h_ld, utf16::MIN_TRAIL_SURR, h_tr);
			return;
		}
	}
	UTF16addContinuous2(root, l_ld, h_ld, l_tr, h_tr);
}